

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O1

int isVDSetTerminator(iso9660 *iso9660,uchar *h)

{
  int iVar1;
  
  if ((*h == 0xff) && (h[6] == '\x01')) {
    iVar1 = bcmp(iso9660->null,h + 7,0x7f9);
    return (uint)(iVar1 == 0);
  }
  return 0;
}

Assistant:

static int
isVDSetTerminator(struct iso9660 *iso9660, const unsigned char *h)
{
	(void)iso9660; /* UNUSED */

	/* Type of the Volume Descriptor Set Terminator must be 255. */
	if (h[0] != 255)
		return (0);

	/* Volume Descriptor Version must be 1. */
	if (h[6] != 1)
		return (0);

	/* Reserved field must be 0. */
	if (!isNull(iso9660, h, 7, 2048-7))
		return (0);

	return (1);
}